

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O0

bool __thiscall cmFindProgramHelper::FileIsExecutableCMP0109(cmFindProgramHelper *this,string *file)

{
  cmMakefile *pcVar1;
  PolicyID id;
  cmAlphaNum local_178;
  string local_148;
  cmAlphaNum local_128;
  string local_f8;
  cmAlphaNum local_d8;
  string local_98;
  cmAlphaNum local_78;
  string local_48;
  undefined1 local_22;
  byte local_21;
  bool isExeNew;
  string *psStack_20;
  bool isExeOld;
  string *file_local;
  cmFindProgramHelper *this_local;
  
  psStack_20 = file;
  file_local = (string *)this;
  if (this->PolicyCMP0109 == OLD) {
    this_local._7_1_ = cmsys::SystemTools::FileExists(file,true);
  }
  else if (this->PolicyCMP0109 - NEW < 3) {
    this_local._7_1_ = cmsys::SystemTools::FileIsExecutable(file);
  }
  else {
    local_21 = cmsys::SystemTools::FileExists(file,true);
    local_22 = cmsys::SystemTools::FileIsExecutable(psStack_20);
    this_local._7_1_ = (bool)local_22;
    if (local_22 != (local_21 & 1)) {
      if ((bool)local_22) {
        pcVar1 = this->Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_98,(cmPolicies *)0x6d,id);
        cmAlphaNum::cmAlphaNum(&local_78,&local_98);
        cmAlphaNum::cmAlphaNum(&local_d8,"\nThe file\n  ");
        cmStrCat<std::__cxx11::string,char[74]>
                  (&local_48,&local_78,&local_d8,psStack_20,
                   (char (*) [74])
                   "\nis executable but not readable.  CMake is ignoring it for compatibility.");
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_98);
      }
      else {
        pcVar1 = this->Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_148,(cmPolicies *)0x6d,id);
        cmAlphaNum::cmAlphaNum(&local_128,&local_148);
        cmAlphaNum::cmAlphaNum(&local_178,"\nThe file\n  ");
        cmStrCat<std::__cxx11::string,char[71]>
                  (&local_f8,&local_128,&local_178,psStack_20,
                   (char (*) [71])
                   "\nis readable but not executable.  CMake is using it for compatibility.");
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_148);
      }
      this_local._7_1_ = (bool)(local_21 & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FileIsExecutableCMP0109(std::string const& file) const
  {
    switch (this->PolicyCMP0109) {
      case cmPolicies::OLD:
        return cmSystemTools::FileExists(file, true);
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        return cmSystemTools::FileIsExecutable(file);
      default:
        break;
    }
    bool const isExeOld = cmSystemTools::FileExists(file, true);
    bool const isExeNew = cmSystemTools::FileIsExecutable(file);
    if (isExeNew == isExeOld) {
      return isExeNew;
    }
    if (isExeNew) {
      this->Makefile->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0109),
                 "\n"
                 "The file\n"
                 "  ",
                 file,
                 "\n"
                 "is executable but not readable.  "
                 "CMake is ignoring it for compatibility."));
    } else {
      this->Makefile->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0109),
                 "\n"
                 "The file\n"
                 "  ",
                 file,
                 "\n"
                 "is readable but not executable.  "
                 "CMake is using it for compatibility."));
    }
    return isExeOld;
  }